

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O3

void __thiscall pbrt::HaltonPixelIndexer::SetPixel(HaltonPixelIndexer *this,Point2i *p)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  HaltonPixelIndexer *pHVar13;
  long lVar14;
  
  this->pixelSampleForIndex = 0;
  uVar8 = (this->baseScales).super_Tuple2<pbrt::Point2,_int>.y *
          (this->baseScales).super_Tuple2<pbrt::Point2,_int>.x;
  if (1 < (int)uVar8) {
    iVar3 = (this->baseExponents).super_Tuple2<pbrt::Point2,_int>.x;
    iVar4 = (this->baseExponents).super_Tuple2<pbrt::Point2,_int>.y;
    piVar1 = &(this->baseScales).super_Tuple2<pbrt::Point2,_int>.y;
    lVar14 = 0;
    lVar10 = 0;
    bVar6 = true;
    do {
      bVar5 = bVar6;
      if (bVar5) {
        pHVar13 = this;
        if (iVar3 < 1) {
LAB_004533c5:
          lVar11 = 0;
        }
        else {
          lVar11 = 0;
          uVar9 = (ulong)((p->super_Tuple2<pbrt::Point2,_int>).x & 0x7f);
          iVar7 = iVar3;
          do {
            uVar12 = (uint)uVar9;
            uVar9 = uVar9 >> 1;
            iVar7 = iVar7 + -1;
            lVar11 = (ulong)(uVar12 & 1) + lVar11 * 2;
          } while (iVar7 != 0);
        }
      }
      else {
        pHVar13 = (HaltonPixelIndexer *)piVar1;
        if (iVar4 < 1) goto LAB_004533c5;
        lVar11 = 0;
        uVar9 = (ulong)((p->super_Tuple2<pbrt::Point2,_int>).y & 0x7f);
        iVar7 = iVar4;
        do {
          lVar11 = lVar11 * 3 + uVar9 % 3;
          iVar7 = iVar7 + -1;
          uVar9 = uVar9 / 3;
        } while (iVar7 != 0);
      }
      piVar2 = this->multInverse + lVar14;
      lVar14 = 1;
      lVar10 = lVar10 + *piVar2 * lVar11 *
                        (long)((int)uVar8 / (pHVar13->baseScales).super_Tuple2<pbrt::Point2,_int>.x)
      ;
      bVar6 = false;
    } while (bVar5);
    this->pixelSampleForIndex = lVar10 % (long)(ulong)uVar8;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    void SetPixel(const Point2i &p) {
        pixelSampleForIndex = 0;

        int sampleStride = baseScales[0] * baseScales[1];
        if (sampleStride > 1) {
            Point2i pm(Mod(p[0], MaxHaltonResolution), Mod(p[1], MaxHaltonResolution));
            for (int i = 0; i < 2; ++i) {
                uint64_t dimOffset =
                    (i == 0) ? InverseRadicalInverse<2>(pm[i], baseExponents[i])
                             : InverseRadicalInverse<3>(pm[i], baseExponents[i]);
                pixelSampleForIndex +=
                    dimOffset * (sampleStride / baseScales[i]) * multInverse[i];
            }
            pixelSampleForIndex %= sampleStride;
        }
    }